

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_data.hpp
# Opt level: O2

void duckdb::ArrowMapData<int>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
  *this;
  ArrowBuffer *pAVar1;
  reference pvVar2;
  type data;
  ArrowArray *pAVar3;
  pointer pAVar4;
  long lVar5;
  reference pvVar6;
  LogicalType *type_00;
  LogicalType *type_01;
  ArrowArray *pAVar7;
  runtime_error *this_00;
  byte bVar8;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_40;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_38;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_30;
  
  bVar8 = 0;
  result->n_buffers = 2;
  pAVar1 = ArrowAppendData::GetMainBuffer(append_data);
  result->buffers[1] = pAVar1->dataptr;
  ArrowAppender::AddChildren(append_data,1);
  result->children =
       (append_data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  result->n_children = 1;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(&append_data->child_data,0);
  data = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
         operator*(pvVar2);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(&append_data->child_data,0);
  local_30._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar2->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar3 = ArrowAppender::FinalizeChild
                     (type,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                            *)&local_30);
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_30);
  ArrowAppender::AddChildren(data,2);
  pAVar3->children =
       (data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  pAVar3->n_buffers = 1;
  pAVar3->n_children = 2;
  this = &data->child_data;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(this,0);
  pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->(pvVar2);
  lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pAVar4->row_count);
  pAVar3->length = lVar5;
  pvVar6 = vector<ArrowArray,_true>::get<true>(&append_data->child_arrays,0);
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pvVar6->length = pAVar3->length;
    pAVar3 = (ArrowArray *)((long)pAVar3 + (ulong)bVar8 * -0x10 + 8);
    pvVar6 = (reference)((long)pvVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  type_00 = MapType::KeyType(type);
  type_01 = MapType::ValueType(type);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(this,0);
  local_38._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar2->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar7 = ArrowAppender::FinalizeChild
                     (type_00,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                               *)&local_38);
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_38);
  pvVar6 = vector<ArrowArray,_true>::get<true>(&data->child_arrays,0);
  pAVar3 = pAVar7;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pvVar6->length = pAVar3->length;
    pAVar3 = (ArrowArray *)((long)pAVar3 + (ulong)bVar8 * -0x10 + 8);
    pvVar6 = (reference)((long)pvVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(this,1);
  local_40._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar2->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar3 = ArrowAppender::FinalizeChild
                     (type_01,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                               *)&local_40);
  pvVar6 = vector<ArrowArray,_true>::get<true>(&data->child_arrays,1);
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pvVar6->length = pAVar3->length;
    pAVar3 = (ArrowArray *)((long)pAVar3 + (ulong)bVar8 * -0x10 + 8);
    pvVar6 = (reference)((long)pvVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_40);
  if (pAVar7->null_count < 1) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"Arrow doesn\'t accept NULL keys on Maps");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		// set up the main map buffer
		D_ASSERT(result);
		result->n_buffers = 2;
		result->buffers[1] = append_data.GetMainBuffer().data();

		// the main map buffer has a single child: a struct
		ArrowAppender::AddChildren(append_data, 1);
		result->children = append_data.child_pointers.data();
		result->n_children = 1;

		auto &struct_data = *append_data.child_data[0];
		auto struct_result = ArrowAppender::FinalizeChild(type, std::move(append_data.child_data[0]));

		// Initialize the struct array data
		const auto struct_child_count = 2;
		ArrowAppender::AddChildren(struct_data, struct_child_count);
		struct_result->children = struct_data.child_pointers.data();
		struct_result->n_buffers = 1;
		struct_result->n_children = struct_child_count;
		struct_result->length = NumericCast<int64_t>(struct_data.child_data[0]->row_count);

		append_data.child_arrays[0] = *struct_result;

		D_ASSERT(struct_data.child_data[0]->row_count == struct_data.child_data[1]->row_count);

		auto &key_type = MapType::KeyType(type);
		auto &value_type = MapType::ValueType(type);
		auto key_data = ArrowAppender::FinalizeChild(key_type, std::move(struct_data.child_data[0]));
		struct_data.child_arrays[0] = *key_data;
		struct_data.child_arrays[1] = *ArrowAppender::FinalizeChild(value_type, std::move(struct_data.child_data[1]));

		// keys cannot have null values
		if (key_data->null_count > 0) {
			throw std::runtime_error("Arrow doesn't accept NULL keys on Maps");
		}
	}